

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_message_digester.hxx
# Opt level: O0

uchar * __thiscall
cryptox::
evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
::update<unsigned_char_const*>
          (evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
           *this,uchar *first,uchar *last)

{
  undefined8 __first;
  int iVar1;
  uchar *__last;
  source_location local_490;
  evp_error local_478;
  uint8_t local_440 [8];
  uint8_t *bytes;
  size_t element_size;
  size_t size;
  uint8_t buffer [1024];
  uchar *itr;
  uchar *last_local;
  uchar *first_local;
  evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1,_160UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
  *this_local;
  
  buffer._1016_8_ = first;
  do {
    if ((uchar *)buffer._1016_8_ == last) {
      return (uchar *)buffer._1016_8_;
    }
    bytes = (uint8_t *)0x1;
    for (element_size = 0; __first = buffer._1016_8_,
        element_size + 1 < 0x400 && (uchar *)buffer._1016_8_ != last;
        element_size = element_size + 1) {
      local_440[0] = buffer[0x3f8];
      local_440[1] = buffer[0x3f9];
      local_440[2] = buffer[0x3fa];
      local_440[3] = buffer[0x3fb];
      local_440[4] = buffer[0x3fc];
      local_440[5] = buffer[0x3fd];
      local_440[6] = buffer[0x3fe];
      local_440[7] = buffer[0x3ff];
      __last = (uchar *)(buffer._1016_8_ + 1);
      buffer._1016_8_ = buffer._1016_8_ + 1;
      std::copy<unsigned_char_const*,unsigned_char*>
                ((uchar *)__first,__last,buffer + (element_size - 8));
    }
    iVar1 = EVP_DigestUpdate(*(EVP_MD_CTX **)this,&size,element_size);
  } while (iVar1 == 1);
  local_478._32_8_ = 0;
  local_478._40_8_ = 0;
  local_478._16_8_ = 0;
  local_478._24_8_ = 0;
  local_478._0_8_ = 0;
  local_478._8_8_ = 0;
  evp_error::evp_error(&local_478);
  boost::source_location::source_location
            (&local_490,
             "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/include/cryptox/message_digests/basic_message_digester.hxx"
             ,0x3f,
             "Input cryptox::evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_sha1, 160>, &EVP_DigestInit_ex, &EVP_DigestUpdate, &EVP_DigestFinal_ex>::update(Input, Input) [Algorithm = cryptox::message_digest_algorithm<&EVP_sha1, 160>, InitFx = &EVP_DigestInit_ex, UpdateFx = &EVP_DigestUpdate, FinalFx = &EVP_DigestFinal_ex, Input = const unsigned char *]"
             ,0);
  boost::throw_exception<cryptox::evp_error>(&local_478,&local_490);
}

Assistant:

Input update(Input first, Input last) {
			Input itr = first;

			while (itr != last) {
				std::uint8_t buffer[1024];
				size_t size = 0;

				const std::size_t element_size = sizeof(*itr);
				while (size + element_size < sizeof(buffer) && itr != last) {
					const std::uint8_t* bytes = (const std::uint8_t*)&*itr++;
					std::copy(bytes, bytes + element_size, &buffer[size]);
					size += element_size;
				}

				if (UpdateFx(_context, buffer, size) != 1)
					BOOST_THROW_EXCEPTION(evp_error());
			}

			return itr;
		}